

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symArrays.cpp
# Opt level: O0

bool StrCmp(char *string1,char *string2)

{
  int local_24;
  int i;
  char *string2_local;
  char *string1_local;
  
  local_24 = 0;
  while( true ) {
    if (string1[local_24] != string2[local_24]) {
      return false;
    }
    if (string1[local_24] == '\0') break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool StrCmp(char string1[], char string2[])
{
    int i = 0;

    //Infinite loop is ok because we have exit conditions.
    while(true)
    {
        if(string1[i] == string2[i])
        {
            if(string1[i] == '\0')
            {
                return true;
            }
            else
            {
                i++;
            }

        }
        else
        {
            return false;
        }
    }
}